

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_split_clients_module.c
# Opt level: O0

char * ngx_conf_split_clients_block(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  undefined1 auVar1 [16];
  ngx_str_t *pnVar2;
  ngx_int_t nVar3;
  ngx_stream_variable_t *pnVar4;
  uint local_f4;
  undefined1 local_f0 [8];
  ngx_stream_compile_complex_value_t ccv;
  ngx_stream_split_clients_part_t *part;
  ngx_stream_split_clients_ctx_t *ctx;
  ngx_stream_variable_t *var;
  ngx_conf_t save;
  ngx_uint_t i;
  ngx_str_t name;
  ngx_str_t *value;
  uint32_t last;
  uint32_t sum;
  char *rv;
  void *conf_local;
  ngx_command_t *cmd_local;
  ngx_conf_t *cf_local;
  
  pnVar2 = (ngx_str_t *)ngx_pcalloc(cf->pool,0x50);
  if (pnVar2 == (ngx_str_t *)0x0) {
    cf_local = (ngx_conf_t *)0xffffffffffffffff;
  }
  else {
    name.data = (u_char *)cf->args->elts;
    memset(local_f0,0,0x20);
    ccv.cf = (ngx_conf_t *)(name.data + 0x10);
    local_f0 = (undefined1  [8])cf;
    ccv.value = pnVar2;
    nVar3 = ngx_stream_compile_complex_value((ngx_stream_compile_complex_value_t *)local_f0);
    if (nVar3 == 0) {
      i = *(ngx_uint_t *)(name.data + 0x20);
      name.len = *(size_t *)(name.data + 0x28);
      if (*(char *)name.len == '$') {
        i = i - 1;
        name.len = name.len + 1;
        pnVar4 = ngx_stream_add_variable(cf,(ngx_str_t *)&i,1);
        if (pnVar4 == (ngx_stream_variable_t *)0x0) {
          cf_local = (ngx_conf_t *)0xffffffffffffffff;
        }
        else {
          pnVar4->get_handler = ngx_stream_split_clients_variable;
          pnVar4->data = (uintptr_t)pnVar2;
          nVar3 = ngx_array_init((ngx_array_t *)&pnVar2[2].data,cf->pool,2,0x18);
          if (nVar3 == 0) {
            memcpy(&var,cf,0x60);
            cf->ctx = pnVar2;
            cf->handler = ngx_stream_split_clients;
            cf->handler_conf = (char *)conf;
            cf_local = (ngx_conf_t *)ngx_conf_parse(cf,(ngx_str_t *)0x0);
            memcpy(cf,&var,0x60);
            if (cf_local == (ngx_conf_t *)0x0) {
              value._4_4_ = 0;
              value._0_4_ = 0;
              ccv._24_8_ = pnVar2[2].data;
              for (save.handler_conf = (char *)0x0; save.handler_conf < (char *)pnVar2[3].len;
                  save.handler_conf = save.handler_conf + 1) {
                if (*(int *)(ccv._24_8_ + (long)save.handler_conf * 0x18) == 0) {
                  local_f4 = 10000;
                }
                else {
                  local_f4 = value._4_4_ + *(int *)(ccv._24_8_ + (long)save.handler_conf * 0x18);
                }
                value._4_4_ = local_f4;
                if (10000 < local_f4) {
                  ngx_conf_log_error(1,cf,0,"percent total is greater than 100%%");
                  return (char *)0xffffffffffffffff;
                }
                if (*(int *)(ccv._24_8_ + (long)save.handler_conf * 0x18) != 0) {
                  auVar1._8_8_ = 0;
                  auVar1._0_8_ = (ulong)*(uint *)(ccv._24_8_ + (long)save.handler_conf * 0x18) *
                                 0xffffffff;
                  value._0_4_ = (int)value + SUB164(auVar1 / ZEXT816(10000),0);
                  *(int *)(ccv._24_8_ + (long)save.handler_conf * 0x18) = (int)value;
                }
              }
            }
          }
          else {
            cf_local = (ngx_conf_t *)0xffffffffffffffff;
          }
        }
      }
      else {
        ngx_conf_log_error(1,cf,0,"invalid variable name \"%V\"",&i);
        cf_local = (ngx_conf_t *)0xffffffffffffffff;
      }
    }
    else {
      cf_local = (ngx_conf_t *)0xffffffffffffffff;
    }
  }
  return (char *)cf_local;
}

Assistant:

static char *
ngx_conf_split_clients_block(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    char                                *rv;
    uint32_t                             sum, last;
    ngx_str_t                           *value, name;
    ngx_uint_t                           i;
    ngx_conf_t                           save;
    ngx_stream_variable_t               *var;
    ngx_stream_split_clients_ctx_t      *ctx;
    ngx_stream_split_clients_part_t     *part;
    ngx_stream_compile_complex_value_t   ccv;

    ctx = ngx_pcalloc(cf->pool, sizeof(ngx_stream_split_clients_ctx_t));
    if (ctx == NULL) {
        return NGX_CONF_ERROR;
    }

    value = cf->args->elts;

    ngx_memzero(&ccv, sizeof(ngx_stream_compile_complex_value_t));

    ccv.cf = cf;
    ccv.value = &value[1];
    ccv.complex_value = &ctx->value;

    if (ngx_stream_compile_complex_value(&ccv) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    name = value[2];

    if (name.data[0] != '$') {
        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                           "invalid variable name \"%V\"", &name);
        return NGX_CONF_ERROR;
    }

    name.len--;
    name.data++;

    var = ngx_stream_add_variable(cf, &name, NGX_STREAM_VAR_CHANGEABLE);
    if (var == NULL) {
        return NGX_CONF_ERROR;
    }

    var->get_handler = ngx_stream_split_clients_variable;
    var->data = (uintptr_t) ctx;

    if (ngx_array_init(&ctx->parts, cf->pool, 2,
                       sizeof(ngx_stream_split_clients_part_t))
        != NGX_OK)
    {
        return NGX_CONF_ERROR;
    }

    save = *cf;
    cf->ctx = ctx;
    cf->handler = ngx_stream_split_clients;
    cf->handler_conf = conf;

    rv = ngx_conf_parse(cf, NULL);

    *cf = save;

    if (rv != NGX_CONF_OK) {
        return rv;
    }

    sum = 0;
    last = 0;
    part = ctx->parts.elts;

    for (i = 0; i < ctx->parts.nelts; i++) {
        sum = part[i].percent ? sum + part[i].percent : 10000;
        if (sum > 10000) {
            ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                               "percent total is greater than 100%%");
            return NGX_CONF_ERROR;
        }

        if (part[i].percent) {
            last += part[i].percent * (uint64_t) 0xffffffff / 10000;
            part[i].percent = last;
        }
    }

    return rv;
}